

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

string * __thiscall
kratos::expr_to_string_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,Expr *expr,bool is_top,bool use_handle,
          bool ignore_top,Generator *scope)

{
  long *plVar1;
  long lVar2;
  undefined8 this_00;
  bool bVar3;
  ExprOp extraout_RDX;
  ExprOp extraout_RDX_00;
  ExprOp extraout_RDX_01;
  ExprOp extraout_RDX_02;
  ExprOp extraout_RDX_03;
  ExprOp extraout_RDX_04;
  ExprOp extraout_RDX_05;
  ExprOp extraout_RDX_06;
  ExprOp EVar4;
  string *this_01;
  undefined7 in_register_00000089;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  Generator *in_stack_ffffffffffffff08;
  undefined1 local_e8 [32];
  undefined1 auStack_c8 [8];
  string left_str;
  undefined1 local_98 [40];
  _Alloc_hider _Stack_70;
  undefined1 auStack_60 [8];
  string right_str;
  
  aVar5._1_7_ = in_register_00000089;
  aVar5._0_1_ = ignore_top;
  right_str.field_2._8_4_ = SUB84(expr,0);
  aVar6 = aVar5;
  bVar3 = is_expand_op(*(ExprOp *)(this + 0x270));
  if (bVar3) {
    if (is_top) {
      (**(code **)(*(long *)this + 0x108))(__return_storage_ptr__,this,use_handle);
    }
    else if (aVar5.values_ ==
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             0x0) {
      (**(code **)(*(long *)this + 0xf8))(__return_storage_ptr__,this);
    }
    else {
      (**(code **)(*(long *)this + 0x110))(__return_storage_ptr__,this,aVar5.values_);
    }
  }
  else {
    if (*(long *)(this + 0x270) == 0x1b) {
      if (is_top) {
        (**(code **)(*(long *)this + 0x108))(local_98,this,use_handle);
      }
      else if (aVar5.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) {
        (**(code **)(*(long *)this + 0xf8))(local_98,this);
      }
      else {
        (**(code **)(*(long *)this + 0x110))(local_98,this,aVar5.values_);
      }
      auStack_c8 = (undefined1  [8])local_98._0_8_;
      left_str._M_dataplus._M_p = (pointer)local_98._8_8_;
      bVar7 = fmt::v7::to_string_view<char,_0>("({0})");
      format_str.data_ = (char *)bVar7.size_;
      format_str.size_ = 0xd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = aVar6.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)auStack_c8;
      fmt::v7::detail::vformat_abi_cxx11_
                (__return_storage_ptr__,(detail *)bVar7.data_,format_str,args);
      this_01 = (string *)local_98;
    }
    else {
      plVar1 = *(long **)(this + 0x278);
      left_str.field_2._8_8_ = *(undefined8 *)(this + 0x280);
      right_str.field_2._12_4_ = ZEXT14(is_top);
      if ((int)plVar1[0x2d] == 1) {
        Var::as<kratos::Expr>((Var *)local_98);
        this_00 = local_98._0_8_;
        lVar2 = *(long *)(this + 0x270);
        Var::as<kratos::Expr>((Var *)auStack_60);
        aVar6 = aVar5;
        expr_to_string_abi_cxx11_
                  ((string *)auStack_c8,(kratos *)this_00,
                   (Expr *)(ulong)(lVar2 == *(long *)((long)auStack_60 + 0x270)),
                   SUB41(right_str.field_2._12_4_,0),use_handle,ignore_top,in_stack_ffffffffffffff08
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&right_str);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
        EVar4 = extraout_RDX;
      }
      else if (is_top) {
        (**(code **)(*plVar1 + 0x108))(auStack_c8,plVar1,use_handle);
        EVar4 = extraout_RDX_00;
      }
      else if (aVar5.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) {
        (**(code **)(*plVar1 + 0xf8))(auStack_c8,plVar1);
        EVar4 = extraout_RDX_02;
      }
      else {
        (**(code **)(*plVar1 + 0x110))(auStack_c8,plVar1,aVar5.values_);
        EVar4 = extraout_RDX_01;
      }
      if (left_str.field_2._8_8_ == 0) {
        if (right_str.field_2._M_local_buf[8] == '\0') {
          ExprOpStr_abi_cxx11_((string *)auStack_60,*(kratos **)(this + 0x270),EVar4);
          local_98._0_8_ = auStack_60;
          local_98._8_8_ = right_str._M_dataplus._M_p;
          local_98._16_8_ = auStack_c8;
          local_98._24_8_ = left_str._M_dataplus._M_p;
          bVar7 = fmt::v7::to_string_view<char,_0>("({0}{1})");
          format_str_01.data_ = (char *)bVar7.size_;
          format_str_01.size_ = 0xdd;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar6.args_;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)bVar7.data_,format_str_01,args_01);
        }
        else {
          ExprOpStr_abi_cxx11_((string *)auStack_60,*(kratos **)(this + 0x270),EVar4);
          local_98._0_8_ = auStack_60;
          local_98._8_8_ = right_str._M_dataplus._M_p;
          local_98._16_8_ = auStack_c8;
          local_98._24_8_ = left_str._M_dataplus._M_p;
          bVar7 = fmt::v7::to_string_view<char,_0>("{0}{1}");
          format_str_00.data_ = (char *)bVar7.size_;
          format_str_00.size_ = 0xdd;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar6.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)bVar7.data_,format_str_00,args_00);
        }
      }
      else {
        if (*(int *)(left_str.field_2._8_8_ + 0x168) == 1) {
          Var::as<kratos::Expr>((Var *)local_98);
          lVar2 = *(long *)(this + 0x270);
          Var::as<kratos::Expr>((Var *)local_e8);
          expr_to_string_abi_cxx11_
                    ((string *)auStack_60,(kratos *)local_98._0_8_,
                     (Expr *)(ulong)(lVar2 == *(long *)(local_e8._0_8_ + 0x270)),
                     SUB41(right_str.field_2._12_4_,0),use_handle,ignore_top,
                     in_stack_ffffffffffffff08);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
          EVar4 = extraout_RDX_03;
          aVar6 = aVar5;
        }
        else if (is_top) {
          (**(code **)(*(long *)left_str.field_2._8_8_ + 0x108))
                    (auStack_60,left_str.field_2._8_8_,use_handle);
          EVar4 = extraout_RDX_04;
        }
        else if (aVar5.values_ ==
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0) {
          (**(code **)(*(long *)left_str.field_2._8_8_ + 0xf8))(auStack_60);
          EVar4 = extraout_RDX_06;
        }
        else {
          (**(code **)(*(long *)left_str.field_2._8_8_ + 0x110))
                    (auStack_60,left_str.field_2._8_8_,aVar5.values_);
          EVar4 = extraout_RDX_05;
        }
        if (right_str.field_2._M_local_buf[8] == '\0') {
          ExprOpStr_abi_cxx11_((string *)local_e8,*(kratos **)(this + 0x270),EVar4);
          local_98._0_8_ = auStack_c8;
          local_98._8_8_ = left_str._M_dataplus._M_p;
          local_98._16_8_ = local_e8._0_8_;
          local_98._24_8_ = local_e8._8_8_;
          local_98._32_8_ = auStack_60;
          _Stack_70._M_p = right_str._M_dataplus._M_p;
          bVar7 = fmt::v7::to_string_view<char,_0>("({0} {1} {2})");
          format_str_03.data_ = (char *)bVar7.size_;
          format_str_03.size_ = 0xddd;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = aVar6.args_;
          args_03.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)bVar7.data_,format_str_03,args_03);
        }
        else {
          ExprOpStr_abi_cxx11_((string *)local_e8,*(kratos **)(this + 0x270),EVar4);
          local_98._0_8_ = auStack_c8;
          local_98._8_8_ = left_str._M_dataplus._M_p;
          local_98._16_8_ = local_e8._0_8_;
          local_98._24_8_ = local_e8._8_8_;
          local_98._32_8_ = auStack_60;
          _Stack_70._M_p = right_str._M_dataplus._M_p;
          bVar7 = fmt::v7::to_string_view<char,_0>("{0} {1} {2}");
          format_str_02.data_ = (char *)bVar7.size_;
          format_str_02.size_ = 0xddd;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = aVar6.values_;
          args_02.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_98;
          fmt::v7::detail::vformat_abi_cxx11_
                    (__return_storage_ptr__,(detail *)bVar7.data_,format_str_02,args_02);
        }
        std::__cxx11::string::~string((string *)local_e8);
      }
      std::__cxx11::string::~string((string *)auStack_60);
      this_01 = (string *)auStack_c8;
    }
    std::__cxx11::string::~string(this_01);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string inline expr_to_string(const Expr *expr, bool is_top, bool use_handle,
                                  bool ignore_top = false, Generator *scope = nullptr) {
    // overloaded to_string methods?
    if (is_expand_op(expr->op))
        return use_handle ? expr->handle_name(ignore_top)
               : scope    ? expr->handle_name(scope)
                          : expr->to_string();
    if (expr->op == ExprOp::Conditional)
        return ::format("({0})", use_handle ? expr->handle_name(ignore_top)
                                 : scope    ? expr->handle_name(scope)
                                            : expr->to_string());

    auto *left = expr->left;
    auto *right = expr->right;

    auto left_str = left->type() == VarType::Expression
                        ? expr_to_string(left->as<Expr>().get(), expr->op == left->as<Expr>()->op,
                                         use_handle, ignore_top, scope)
                        : (use_handle ? left->handle_name(ignore_top)
                           : scope    ? left->handle_name(scope)
                                      : left->to_string());

    if (right != nullptr) {
        auto right_str =
            right->type() == VarType::Expression
                ? expr_to_string(right->as<Expr>().get(), expr->op == right->as<Expr>()->op,
                                 use_handle, ignore_top, scope)
                : (use_handle ? right->handle_name(ignore_top)
                   : scope    ? right->handle_name(scope)
                              : right->to_string());
        if (is_top)
            return ::format("{0} {1} {2}", left_str, ExprOpStr(expr->op), right_str);
        else
            return ::format("({0} {1} {2})", left_str, ExprOpStr(expr->op), right_str);
    } else {
        if (is_top)
            return ::format("{0}{1}", ExprOpStr(expr->op), left_str);
        else
            return ::format("({0}{1})", ExprOpStr(expr->op), left_str);
    }
}